

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRet.c
# Opt level: O0

void Rtm_ObjAddFirst2(Rtm_Man_t *p,Rtm_Edg_t *pEdge,Rtm_Init_t Val)

{
  uint uVar1;
  int iVar2;
  uint *puVar3;
  Rtm_Init_t Temp;
  uint *pE;
  uint *pB;
  Rtm_Init_t Val_local;
  Rtm_Edg_t *pEdge_local;
  Rtm_Man_t *p_local;
  
  pE = p->pExtra + (int)(*(uint *)pEdge >> 0xc);
  uVar1 = (*(uint *)pEdge & 0xfff) + 1 & 0xfff;
  *(uint *)pEdge = *(uint *)pEdge & 0xfffff000 | uVar1;
  iVar2 = Rtm_InitWordsNum(uVar1);
  puVar3 = pE + iVar2;
  pB._4_4_ = Val;
  if (Val == RTM_VAL_NONE) {
    __assert_fail("Val != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigRet.c"
                  ,0x100,"void Rtm_ObjAddFirst2(Rtm_Man_t *, Rtm_Edg_t *, Rtm_Init_t)");
  }
  for (; pE < puVar3; pE = pE + 1) {
    uVar1 = *pE;
    *pE = *pE << 2 | pB._4_4_;
    pB._4_4_ = uVar1 >> 0x1e;
  }
  return;
}

Assistant:

void Rtm_ObjAddFirst2( Rtm_Man_t * p, Rtm_Edg_t * pEdge, Rtm_Init_t Val ) 
{
    unsigned * pB = p->pExtra + pEdge->LData, * pE = pB + Rtm_InitWordsNum( ++pEdge->nLats ); 
    Rtm_Init_t Temp;
    assert( Val != 0 );
    while ( pB < pE ) 
    {
        Temp = (Rtm_Init_t)(*pB >> 30);
        *pB = (*pB << 2) | Val;
        Val = Temp;
        pB++;
    }
}